

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_output_clone_alloc(wally_tx_output *src,wally_tx_output **output)

{
  int iVar1;
  wally_tx_output *output_00;
  
  if (output == (wally_tx_output **)0x0) {
    iVar1 = -2;
  }
  else {
    *output = (wally_tx_output *)0x0;
    output_00 = (wally_tx_output *)wally_calloc(0x70);
    *output = output_00;
    if (output_00 == (wally_tx_output *)0x0) {
      iVar1 = -3;
    }
    else {
      iVar1 = wally_tx_output_clone(src,output_00);
      if (iVar1 != 0) {
        wally_free(output_00);
        *output = (wally_tx_output *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

int wally_tx_output_clone_alloc(const struct wally_tx_output *src,
                                struct wally_tx_output **output)
{
    struct wally_tx_output *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_output);

    ret = wally_tx_output_clone(src, result);
    if (ret != WALLY_OK) {
        wally_free(result);
        *output = NULL;
    }
    return ret;
}